

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity
          (SurfaceFaceVectorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors_,SurfaceMesh *mesh_,VectorType vectorType_)

{
  SurfaceMesh *pSVar1;
  string sStack_48;
  
  pSVar1 = mesh_;
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (&this->super_SurfaceVectorQuantity,&sStack_48,mesh_,(MeshElement)pSVar1);
  std::__cxx11::string::~string((string *)&sStack_48);
  *(undefined ***)&this->super_SurfaceVectorQuantity = &PTR__SurfaceFaceVectorQuantity_005974b0;
  VectorQuantity<polyscope::SurfaceFaceVectorQuantity>::VectorQuantity
            (&this->super_VectorQuantity<polyscope::SurfaceFaceVectorQuantity>,this,vectors_,
             (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             (*(long *)&(this->super_SurfaceVectorQuantity).field_0x190 + 0xd68),vectorType_);
  *(undefined ***)&this->super_SurfaceVectorQuantity = &PTR__SurfaceFaceVectorQuantity_005974b0;
  return;
}

Assistant:

SurfaceFaceVectorQuantity::SurfaceFaceVectorQuantity(std::string name, std::vector<glm::vec3> vectors_,
                                                     SurfaceMesh& mesh_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::FACE),
      VectorQuantity<SurfaceFaceVectorQuantity>(*this, vectors_, parent.faceCenters, vectorType_) {}